

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

void __thiscall
capnp::anon_unknown_1::CapnpcCppMain::getTransitiveSuperclasses
          (CapnpcCppMain *this,InterfaceSchema schema,
          map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
          *map)

{
  InterfaceSchema this_00;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *map_00;
  uint index;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_bool> pVar1;
  Schema local_70;
  SuperclassList local_68;
  pair<unsigned_long,_capnp::InterfaceSchema> local_30;
  
  local_70.raw = (RawBrandedSchema *)this;
  Schema::getProto((Reader *)&local_68,&local_70);
  if (local_68.list.reader.elementCount < 0x40) {
    local_30.first = 0;
  }
  else {
    local_30.first = (unsigned_long)(local_68.list.reader.capTable)->_vptr_CapTableReader;
  }
  local_30.second.super_Schema.raw = (Schema)(Schema)local_70.raw;
  pVar1 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,capnp::InterfaceSchema>,std::_Select1st<std::pair<unsigned_long_const,capnp::InterfaceSchema>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::InterfaceSchema>>>
          ::_M_emplace_unique<std::pair<unsigned_long,capnp::InterfaceSchema>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,capnp::InterfaceSchema>,std::_Select1st<std::pair<unsigned_long_const,capnp::InterfaceSchema>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::InterfaceSchema>>>
                      *)schema.super_Schema.raw,&local_30);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    InterfaceSchema::getSuperclasses(&local_68,(InterfaceSchema *)&local_70);
    if (local_68.list.reader.elementCount != 0) {
      index = 0;
      do {
        this_00 = InterfaceSchema::SuperclassList::operator[](&local_68,index);
        getTransitiveSuperclasses((CapnpcCppMain *)this_00.super_Schema.raw,schema,map_00);
        index = index + 1;
      } while (local_68.list.reader.elementCount != index);
    }
  }
  return;
}

Assistant:

void getTransitiveSuperclasses(InterfaceSchema schema, std::map<uint64_t, InterfaceSchema>& map) {
    if (map.insert(std::make_pair(schema.getProto().getId(), schema)).second) {
      for (auto sup: schema.getSuperclasses()) {
        getTransitiveSuperclasses(sup, map);
      }
    }
  }